

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O1

void __thiscall IRBuilder::InjectBailOut(IRBuilder *this,uint offset)

{
  Func *pFVar1;
  code *pcVar2;
  ExecutionMode EVar3;
  bool bVar4;
  uint bailOutOffset;
  IntConstOpnd *this_00;
  BailOutInfo *this_01;
  BailOutInstrTemplate<IR::Instr> *instr;
  undefined4 *puVar5;
  IntConstOpnd *pIVar6;
  byte bVar7;
  
  EVar3 = JITTimeWorkItem::GetJitMode(this->m_func->m_workItem);
  if (EVar3 == SimpleJit) {
    return;
  }
  this_00 = IR::IntConstOpnd::New(0,TyInt32,this->m_func,false);
  bailOutOffset = offset;
  if (offset == 0xffffffff) {
    bailOutOffset = IR::Instr::GetByteCodeOffset(this->m_lastInstr);
  }
  this_01 = (BailOutInfo *)new<Memory::JitArenaAllocator>(0xb8,this->m_func->m_alloc,0x3f1274);
  BailOutInfo::BailOutInfo(this_01,bailOutOffset,this->m_func);
  instr = IR::BailOutInstrTemplate<IR::Instr>::New
                    (BailOnEqual,BailOutInjected,this_01,this_01->bailOutFunc);
  if ((instr->super_Instr).m_src1 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src.");
    if (!bVar4) goto LAB_004c7713;
    *puVar5 = 0;
  }
  pFVar1 = (instr->super_Instr).m_func;
  if ((this_00->super_Opnd).isDeleted == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x14,"(!isDeleted)","Using deleted operand");
    if (!bVar4) goto LAB_004c7713;
    *puVar5 = 0;
  }
  bVar7 = (this_00->super_Opnd).field_0xb;
  pIVar6 = this_00;
  if ((bVar7 & 2) != 0) {
    pIVar6 = (IntConstOpnd *)IR::Opnd::Copy(&this_00->super_Opnd,pFVar1);
    bVar7 = (pIVar6->super_Opnd).field_0xb;
  }
  (pIVar6->super_Opnd).field_0xb = bVar7 | 2;
  (instr->super_Instr).m_src1 = &pIVar6->super_Opnd;
  if ((instr->super_Instr).m_src2 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x18b,"(this->m_src2 == __null)","Trying to overwrite existing src.");
    if (!bVar4) goto LAB_004c7713;
    *puVar5 = 0;
  }
  pFVar1 = (instr->super_Instr).m_func;
  if ((this_00->super_Opnd).isDeleted == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x14,"(!isDeleted)","Using deleted operand");
    if (!bVar4) {
LAB_004c7713:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  bVar7 = (this_00->super_Opnd).field_0xb;
  if ((bVar7 & 2) != 0) {
    this_00 = (IntConstOpnd *)IR::Opnd::Copy(&this_00->super_Opnd,pFVar1);
    bVar7 = (this_00->super_Opnd).field_0xb;
  }
  (this_00->super_Opnd).field_0xb = bVar7 | 2;
  (instr->super_Instr).m_src2 = &this_00->super_Opnd;
  AddInstr(this,&instr->super_Instr,offset);
  return;
}

Assistant:

void
IRBuilder::InjectBailOut(uint offset)
{
    if(m_func->IsSimpleJit())
    {
        return; // bailout injection is only applicable to full JIT
    }

    IR::IntConstOpnd * opnd = IR::IntConstOpnd::New(0, TyInt32, m_func);
    uint bailOutOffset = offset;
    if (bailOutOffset == Js::Constants::NoByteCodeOffset)
    {
        bailOutOffset = m_lastInstr->GetByteCodeOffset();
    }
    BailOutInfo * bailOutInfo = JitAnew(m_func->m_alloc, BailOutInfo, bailOutOffset, m_func);
    IR::BailOutInstr * instr = IR::BailOutInstr::New(Js::OpCode::BailOnEqual, IR::BailOutInjected, bailOutInfo, bailOutInfo->bailOutFunc);
    instr->SetSrc1(opnd);
    instr->SetSrc2(opnd);
    this->AddInstr(instr, offset);
}